

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_cs_derived.cpp
# Opt level: O2

bool lower_cs_derived(gl_linked_shader *shader)

{
  lower_cs_derived_visitor v;
  
  if (shader->Stage == MESA_SHADER_COMPUTE) {
    ir_hierarchical_visitor::ir_hierarchical_visitor(&v.super_ir_hierarchical_visitor);
    v.super_ir_hierarchical_visitor._vptr_ir_hierarchical_visitor =
         (_func_int **)&PTR_visit_00250150;
    v.super_ir_hierarchical_visitor._49_1_ = 0;
    v.local_size_variable = (bool)(*(byte *)((long)&(shader->Program->info).field_34 + 8) & 1);
    v.gl_WorkGroupSize = (ir_rvalue *)0x0;
    v.gl_WorkGroupID = (ir_variable *)0x0;
    v.gl_LocalInvocationID = (ir_variable *)0x0;
    v.gl_GlobalInvocationID = (ir_variable *)0x0;
    v.gl_LocalInvocationIndex = (ir_variable *)0x0;
    v.shader = shader;
    v.main_sig = _mesa_get_main_function_signature(shader->symbols);
    if (v.main_sig == (ir_function_signature *)0x0) {
      __assert_fail("main_sig",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_cs_derived.cpp"
                    ,0x41,
                    "(anonymous namespace)::lower_cs_derived_visitor::lower_cs_derived_visitor(gl_linked_shader *)"
                   );
    }
    ir_hierarchical_visitor::run(&v.super_ir_hierarchical_visitor,shader->ir);
  }
  else {
    v.super_ir_hierarchical_visitor._49_1_ = 0;
  }
  return (bool)v.super_ir_hierarchical_visitor._49_1_;
}

Assistant:

bool
lower_cs_derived(gl_linked_shader *shader)
{
   if (shader->Stage != MESA_SHADER_COMPUTE)
      return false;

   lower_cs_derived_visitor v(shader);
   v.run(shader->ir);

   return v.progress;
}